

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * QLocale::languageToCode(Language language,LanguageCodeTypes codeTypes)

{
  QLatin1StringView latin1;
  array<char,_4UL> aVar1;
  undefined4 in_EDX;
  undefined2 in_SI;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  array<char,_4UL> code;
  undefined6 in_stack_ffffffffffffffc8;
  QLatin1String *this;
  LanguageCodeTypes in_stack_ffffffffffffffd8;
  char *pcVar2;
  
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  aVar1 = QLocalePrivate::languageToCode
                    ((Language)((ulong)in_RDI >> 0x30),in_stack_ffffffffffffffd8);
  std::array<char,_4UL>::data((array<char,_4UL> *)0x4cb0ef);
  QLatin1String::QLatin1String(this,(char *)CONCAT26(in_SI,in_stack_ffffffffffffffc8));
  latin1.m_size._4_1_ = aVar1._M_elems[0];
  latin1.m_size._5_1_ = aVar1._M_elems[1];
  latin1.m_size._6_1_ = aVar1._M_elems[2];
  latin1.m_size._7_1_ = aVar1._M_elems[3];
  latin1.m_size._0_4_ = in_EDX;
  latin1.m_data = pcVar2;
  QString::QString((QString *)this,latin1);
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar2) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::languageToCode(Language language, LanguageCodeTypes codeTypes)
{
    const auto code = QLocalePrivate::languageToCode(language, codeTypes);
    return QLatin1StringView{code.data()};
}